

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O0

int decodedata(char **buf,size_t *len)

{
  size_t local_38;
  size_t src_len;
  uchar *buf64;
  size_t *psStack_20;
  CURLcode error;
  size_t *len_local;
  char **buf_local;
  
  buf64._4_4_ = 0;
  src_len = 0;
  local_38 = 0;
  if (*len == 0) {
    buf_local._4_4_ = 0;
  }
  else {
    psStack_20 = len;
    len_local = (size_t *)buf;
    buf64._4_4_ = Curl_base64_decode(*buf,(uchar **)&src_len,&local_38);
    if (buf64._4_4_ == CURLE_OK) {
      if (local_38 == 0) {
        (*Curl_cfree)((void *)src_len);
        buf_local._4_4_ = -1;
      }
      else {
        memcpy((void *)*len_local,(void *)src_len,local_38);
        *psStack_20 = local_38;
        *(undefined1 *)(*len_local + local_38) = 0;
        (*Curl_cfree)((void *)src_len);
        buf_local._4_4_ = 0;
      }
    }
    else {
      buf_local._4_4_ = -1;
    }
  }
  return buf_local._4_4_;
}

Assistant:

static int decodedata(char  **buf,   /* dest buffer */
                      size_t *len)   /* dest buffer data length */
{
  CURLcode error = CURLE_OK;
  unsigned char *buf64 = NULL;
  size_t src_len = 0;

  if(!*len)
    return GPE_OK;

  /* base64 decode the given buffer */
  error = Curl_base64_decode(*buf, &buf64, &src_len);
  if(error)
    return GPE_OUT_OF_MEMORY;

  if(!src_len) {
    /*
    ** currently there is no way to tell apart an OOM condition in
    ** Curl_base64_decode() from zero length decoded data. For now,
    ** let's just assume it is an OOM condition, currently we have
    ** no input for this function that decodes to zero length data.
    */
    free(buf64);

    return GPE_OUT_OF_MEMORY;
  }

  /* memcpy to support binary blobs */
  memcpy(*buf, buf64, src_len);
  *len = src_len;
  *(*buf + src_len) = '\0';

  free(buf64);

  return GPE_OK;
}